

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,char *str,char *str_end)

{
  ImGuiID id_00;
  uint *puVar1;
  long in_RDX;
  char *in_RSI;
  long in_RDI;
  ImGuiID id;
  ImGuiID seed;
  undefined8 local_30;
  
  puVar1 = ImVector<unsigned_int>::back((ImVector<unsigned_int> *)(in_RDI + 200));
  if (in_RDX == 0) {
    local_30 = 0;
  }
  else {
    local_30 = in_RDX - (long)in_RSI;
  }
  id_00 = ImHashStr(in_RSI,local_30,*puVar1);
  ImGui::KeepAliveID(id_00);
  return id_00;
}

Assistant:

ImGuiID ImGuiWindow::GetID(const char* str, const char* str_end)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashStr(str, str_end ? (str_end - str) : 0, seed);
    ImGui::KeepAliveID(id);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO2(id, ImGuiDataType_String, str, str_end);
#endif
    return id;
}